

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Gluco::Clause::Clause<Gluco::Clause>(Clause *this,Clause *ps,bool use_extra,bool learnt)

{
  ulong uVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  int i;
  long lVar5;
  
  uVar2 = (ulong)(uint)((int)CONCAT71(in_register_00000009,learnt) << 2);
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000011,use_extra) << 3);
  *(ulong *)&this->header = *(ulong *)&this->header & 0xffffffffffffffe0 | uVar3 | uVar2;
  uVar1 = *(ulong *)&ps->header;
  *(ulong *)&this->header = uVar1 & 0xffffffff00000000 | uVar3 | uVar2 | 0x80000000;
  for (lVar5 = 0; lVar5 < *(int *)&(ps->header).field_0x4; lVar5 = lVar5 + 1) {
    *(undefined4 *)(&this[1].header.field_0x0 + lVar5 * 4) =
         *(undefined4 *)(&ps[1].header.field_0x0 + lVar5 * 4);
  }
  if (use_extra) {
    if (!learnt) {
      uVar1 = *(ulong *)&this->header;
      if ((uVar1 & 8) != 0) {
        uVar2 = 0;
        uVar4 = (uint)(uVar1 >> 0x20);
        uVar3 = 0;
        if (uVar4 != 0 && -1 < (long)uVar1) {
          uVar3 = (ulong)uVar4;
        }
        uVar4 = 0;
        for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
          uVar4 = uVar4 | 1 << ((byte)(&this[1].header.field_0x0)[uVar2 * 4] >> 1 & 0x1f);
        }
        *(uint *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = uVar4;
        return;
      }
      __assert_fail("header.has_extra",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SolverTypes.h"
                    ,0xaa,"void Gluco::Clause::calcAbstraction()");
    }
    *(undefined4 *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = 0;
  }
  return;
}

Assistant:

Clause(const V& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();
    header.lbd = 0;
    header.canbedel = 1;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
    
        if (header.has_extra){
      if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction(); }
    }